

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void PreEvaluate(Situation *situation)

{
  bool bVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  long in_RDI;
  int pos_1;
  int i_10;
  int pos;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int r;
  int black_horsecannon_nums;
  int red_horse_cannon_nums;
  int black_rook_nums;
  int red_rook_nums;
  int others_nums;
  int horse_cannon_nums;
  int rook_nums;
  int attackless_pawn_value [256];
  int attacking_pawn_value [256];
  int midgame_value;
  int black_simple_value;
  int red_simple_value;
  int black_attacks;
  int red_attacks;
  int red_value;
  int black_value;
  int side_tag;
  int local_878;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  int local_850;
  int local_84c;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c [513];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_10 = 0;
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_28 = 0;
  local_8 = in_RDI;
  memset(local_82c + 0x101,0,0x400);
  memset(local_82c + 1,0,0x400);
  local_82c[0] = 0;
  local_830 = 0;
  local_834 = 0;
  local_838 = 0;
  local_83c = 0;
  local_840 = 0;
  local_844 = 0;
  for (local_848 = 0; local_848 < 2; local_848 = local_848 + 1) {
    local_c = local_848 * 0x10 + 0x10;
    for (local_84c = 0; local_84c < 0x10; local_84c = local_84c + 1) {
      if ((local_84c == 7) || (local_84c == 8)) {
        if (*(char *)(local_8 + 0x104 + (long)(local_c + local_84c)) != '\0') {
          local_82c[0] = local_82c[0] + 1;
          if (local_848 == 0) {
            local_838 = local_838 + 1;
          }
          else {
            local_83c = local_83c + 1;
          }
        }
      }
      else if ((((local_84c == 5) || (local_84c == 6)) || (local_84c == 9)) || (local_84c == 10)) {
        if (*(char *)(local_8 + 0x104 + (long)(local_c + local_84c)) != '\0') {
          local_830 = local_830 + 1;
          if (local_848 == 0) {
            local_840 = local_840 + 1;
          }
          else {
            local_844 = local_844 + 1;
          }
        }
      }
      else if (*(char *)(local_8 + 0x104 + (long)(local_c + local_84c)) != '\0') {
        local_834 = local_834 + 1;
      }
    }
  }
  local_834 = local_834 + local_830 * 3 + local_82c[0] * 6 + local_28;
  local_28 = ((0x84 - local_834) * local_834) / 0x42;
  AdvancedValue = (local_28 * 4 + 2) / 0x42;
  *(bool *)(local_8 + 0x210) = 0x3e < local_28;
  for (local_850 = 0; local_850 < 0x100; local_850 = local_850 + 1) {
    if (""[local_850] != '\0') {
      iVar4 = (KING_PAWN_MIDGAME_ATTACKING_VALUE[local_850] * local_28 +
              KING_PAWN_ENDGAME_ATTACKING_VALUE[local_850] * (0x42 - local_28)) / 0x42;
      PiecesValue[1][0][0xfe - local_850] = iVar4;
      PiecesValue[0][0][local_850] = iVar4;
      iVar4 = (HORSE_MIDGAME_VALUE[local_850] * local_28 +
              HORSE_ENDGAME_VALUE[local_850] * (0x42 - local_28)) / 0x42;
      PiecesValue[1][3][0xfe - local_850] = iVar4;
      PiecesValue[0][3][local_850] = iVar4;
      iVar4 = (ROOK_MIDGAME_VALUE[local_850] * local_28 +
              ROOK_ENDGAME_VALUE[local_850] * (0x42 - local_28)) / 0x42;
      PiecesValue[1][4][0xfe - local_850] = iVar4;
      PiecesValue[0][4][local_850] = iVar4;
      iVar4 = (CANNON_MIDGAME_VALUE[local_850] * local_28 +
              CANNON_ENDGAME_VALUE[local_850] * (0x42 - local_28)) / 0x42;
      PiecesValue[1][5][0xfe - local_850] = iVar4;
      PiecesValue[0][5][local_850] = iVar4;
      local_82c[(long)local_850 + 0x101] = PiecesValue[0][0][local_850];
      local_82c[(long)local_850 + 1] =
           (KING_PAWN_MIDGAME_ATTACKLESS_VALUE[local_850] * local_28 +
           KING_PAWN_ENDGAME_ATTACKLESS_VALUE[local_850] * (0x42 - local_28)) / 0x42;
    }
  }
  for (local_854 = 0; local_854 < 0x10; local_854 = local_854 + 1) {
    HollowThreat[local_854] = (HOLLOW_THREAT_VALUE[local_854] * (local_28 + 0x42)) / 0x84;
    CentralThreat[local_854] = CENTRAL_THREAT_VALUE[local_854];
  }
  for (local_858 = 0x15; local_858 < 0x19; local_858 = local_858 + 1) {
    if ((*(char *)(local_8 + 0x104 + (long)local_858) != '\0') &&
       (bVar1 = BlackHalf((uint)*(byte *)(local_8 + 0x104 + (long)local_858)), bVar1)) {
      local_18 = local_18 + 2;
    }
  }
  for (local_85c = 0x19; local_85c < 0x20; local_85c = local_85c + 1) {
    if ((*(char *)(local_8 + 0x104 + (long)local_85c) != '\0') &&
       (bVar1 = BlackHalf((uint)*(byte *)(local_8 + 0x104 + (long)local_85c)), bVar1)) {
      local_18 = local_18 + 1;
    }
  }
  for (local_860 = 0x25; local_860 < 0x29; local_860 = local_860 + 1) {
    if ((*(char *)(local_8 + 0x104 + (long)local_860) != '\0') &&
       (bVar1 = WhiteHalf((uint)*(byte *)(local_8 + 0x104 + (long)local_860)), bVar1)) {
      local_1c = local_1c + 2;
    }
  }
  for (local_864 = 0x29; local_864 < 0x30; local_864 = local_864 + 1) {
    if ((*(char *)(local_8 + 0x104 + (long)local_864) != '\0') &&
       (bVar1 = WhiteHalf((uint)*(byte *)(local_8 + 0x104 + (long)local_864)), bVar1)) {
      local_1c = local_1c + 1;
    }
  }
  local_20 = local_838 * 2 + local_840;
  local_24 = local_83c * 2 + local_844;
  if (local_24 < local_20) {
    local_18 = (local_20 - local_24) * 2 + local_18;
  }
  else {
    local_1c = (local_24 - local_20) * 2 + local_1c;
  }
  piVar3 = std::min<int>(&local_18,&TOTAL_ATTACK_VALUE);
  local_18 = *piVar3;
  piVar3 = std::min<int>(&local_1c,&TOTAL_ATTACK_VALUE);
  iVar4 = *piVar3;
  BlackAdvisorLeakage = (local_18 * 0x50) / 8;
  RedAdvisorLeakage = (iVar4 * 0x50) / 8;
  for (local_868 = 0; local_868 < 0x100; local_868 = local_868 + 1) {
    if (""[local_868] != '\0') {
      iVar5 = (THREATENED_ADVISOR_BISHOP_VALUE[local_868] * iVar4 +
              THREATLESS_ADVISOR_BISHOP_VALUE[local_868] * (8 - iVar4)) / 8;
      PiecesValue[0][2][local_868] = iVar5;
      PiecesValue[0][1][local_868] = iVar5;
      iVar5 = (THREATENED_ADVISOR_BISHOP_VALUE[0xfe - local_868] * local_18 +
              THREATLESS_ADVISOR_BISHOP_VALUE[0xfe - local_868] * (8 - local_18)) / 8;
      PiecesValue[1][2][local_868] = iVar5;
      PiecesValue[1][1][local_868] = iVar5;
      PiecesValue[0][6][local_868] =
           (local_82c[(long)local_868 + 0x101] * local_18 +
           local_82c[(long)local_868 + 1] * (8 - local_18)) / 8;
      PiecesValue[1][6][local_868] =
           (local_82c[(long)(0xfe - local_868) + 0x101] * iVar4 +
           local_82c[(long)(0xfe - local_868) + 1] * (8 - iVar4)) / 8;
    }
  }
  for (local_86c = 0; local_86c < 0x10; local_86c = local_86c + 1) {
    RedBottomThreat[local_86c] = (BOTTOM_THREAT[local_86c] * iVar4) / 8;
    BlackBottomThreat[local_86c] = (BOTTOM_THREAT[local_86c] * local_18) / 8;
  }
  local_14 = ((8 - iVar4) * 0x50) / 8;
  local_10 = ((8 - local_18) * 0x50) / 8;
  for (local_870 = 0x10; local_870 < 0x20; local_870 = local_870 + 1) {
    uVar2 = (uint)*(byte *)(local_8 + 0x104 + (long)local_870);
    if (uVar2 != 0) {
      local_14 = PiecesValue[0][PIECE_NUM_TO_TYPE[local_870]][(int)uVar2] + local_14;
    }
  }
  for (local_878 = 0x20; local_878 < 0x30; local_878 = local_878 + 1) {
    uVar2 = (uint)*(byte *)(local_8 + 0x104 + (long)local_878);
    if (uVar2 != 0) {
      local_10 = *(int *)((long)PIECE_NUM_TO_TYPE[local_878] * 0x400 + 0x350600 +
                         (long)(int)uVar2 * 4) + local_10;
    }
  }
  *(int *)(local_8 + 0x174) = local_14;
  *(int *)(local_8 + 0x178) = local_10;
  return;
}

Assistant:

void PreEvaluate(Situation &situation)
{
    int side_tag;                             //用于标志行走方
    int black_value = 0, red_value = 0;       //记录价值
    int red_attacks = 0, black_attacks = 0;   //双方威胁值
    int red_simple_value, black_simple_value; //双方轻子价值
    int midgame_value = 0;
    int attacking_pawn_value[256] = {0}, attackless_pawn_value[256] = {0};

    //首先判断局势处于开中局还是残局阶段，方法是计算各种棋子的数量，按照车=6、马炮=3、其它=1相加。
    //统计三类棋子数量
    int rook_nums = 0, horse_cannon_nums = 0, others_nums = 0;
    int red_rook_nums = 0, black_rook_nums = 0, red_horse_cannon_nums = 0, black_horsecannon_nums = 0;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        for (int i = 0; i < 16; i++)
        {
            if (i == 7 || i == 8) //车
            {
                if (situation.current_pieces[side_tag + i])
                {
                    rook_nums++;
                    if (r == 0)
                        red_rook_nums++;
                    else
                        black_rook_nums++;
                }
            }
            else if (i == 5 || i == 6 || i == 9 || i == 10) //马炮
            {
                if (situation.current_pieces[side_tag + i])
                {
                    horse_cannon_nums++;
                    if (r == 0)
                        red_horse_cannon_nums++;
                    else
                        black_horsecannon_nums++;
                }
            }
            else
            {
                if (situation.current_pieces[side_tag + i])
                    others_nums++;
            }
        }
    }
    midgame_value += rook_nums * ROOK_VALUE;
    midgame_value += horse_cannon_nums * HORSE_CANNON_VALUE;
    midgame_value += others_nums * OTHER_VALUE;
    //使用二次函数，子力很少时才认为接近残局
    midgame_value = (2 * TOTAL_MIDGAME_VALUE - midgame_value) * midgame_value / TOTAL_MIDGAME_VALUE;
    AdvancedValue = (TOTAL_AdvancedValue * midgame_value + TOTAL_AdvancedValue / 2) / TOTAL_MIDGAME_VALUE;
    situation.UseBook = midgame_value > 62;
    //计算将车马炮的价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][0][i] = PiecesValue[BLACK][0][254 - i] = ((KING_PAWN_MIDGAME_ATTACKING_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKING_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][3][i] = PiecesValue[BLACK][3][254 - i] = ((HORSE_MIDGAME_VALUE[i] * midgame_value + HORSE_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][4][i] = PiecesValue[BLACK][4][254 - i] = ((ROOK_MIDGAME_VALUE[i] * midgame_value + ROOK_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][5][i] = PiecesValue[BLACK][5][254 - i] = ((CANNON_MIDGAME_VALUE[i] * midgame_value + CANNON_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            attacking_pawn_value[i] = PiecesValue[RED][0][i];
            attackless_pawn_value[i] = ((KING_PAWN_MIDGAME_ATTACKLESS_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKLESS_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
        }
    }

    //计算空头炮和中炮威胁值
    for (int i = 0; i < 16; i++)
    {
        HollowThreat[i] = HOLLOW_THREAT_VALUE[i] * (midgame_value + TOTAL_MIDGAME_VALUE) / (TOTAL_MIDGAME_VALUE * 2);
        CentralThreat[i] = CENTRAL_THREAT_VALUE[i];
    }

    //然后判断各方是否处于进攻状态，方法是计算各种过河棋子的数量，按照车马2炮兵1相加。
    for (int i = 16 + 5; i <= 16 + 8; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks += 2;
    }
    for (int i = 16 + 9; i <= 16 + 15; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks++;
    }
    for (int i = 32 + 5; i <= 32 + 8; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks += 2;
    }
    for (int i = 32 + 9; i <= 32 + 15; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks++;
    }

    //如果本方轻子数比对方多，那么每多一个轻子(车算2个轻子)威胁值加2。威胁值最多不超过8。
    red_simple_value = red_rook_nums * 2 + red_horse_cannon_nums;
    black_simple_value = black_rook_nums * 2 + black_horsecannon_nums;
    if (red_simple_value > black_simple_value)
    {
        red_attacks += (red_simple_value - black_simple_value) * 2;
    }
    else
    {
        black_attacks += (black_simple_value - red_simple_value) * 2;
    }
    red_attacks = std::min(red_attacks, TOTAL_ATTACK_VALUE);
    black_attacks = std::min(black_attacks, TOTAL_ATTACK_VALUE);

    //计算士的缺值
    BlackAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * red_attacks / TOTAL_ATTACK_VALUE;
    RedAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * black_attacks / TOTAL_ATTACK_VALUE;

    //计算士象兵价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][1][i] = PiecesValue[RED][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[i] * black_attacks +
                                                                THREATLESS_ADVISOR_BISHOP_VALUE[i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                                               TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][1][i] = PiecesValue[BLACK][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[254 - i] * red_attacks +
                                                                    THREATLESS_ADVISOR_BISHOP_VALUE[254 - i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                                                   TOTAL_ATTACK_VALUE);
            PiecesValue[RED][6][i] = ((attacking_pawn_value[i] * red_attacks +
                                       attackless_pawn_value[i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                      TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][6][i] = ((attacking_pawn_value[254 - i] * black_attacks +
                                         attackless_pawn_value[254 - i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                        TOTAL_ATTACK_VALUE);
        }
    }

    //计算沉底炮威胁值
    for (int i = 0; i < 16; i++)
    {
        RedBottomThreat[i] = BOTTOM_THREAT[i] * black_attacks / TOTAL_ATTACK_VALUE;
        BlackBottomThreat[i] = BOTTOM_THREAT[i] * red_attacks / TOTAL_ATTACK_VALUE;
    }

    // 调整不受威胁方少掉的仕(士)相(象)分值
    red_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - black_attacks) / TOTAL_ATTACK_VALUE;
    black_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - red_attacks) / TOTAL_ATTACK_VALUE;
    // 最后重新计算子力位置分
    for (int i = 16; i < 32; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            red_value += PiecesValue[RED][PIECE_NUM_TO_TYPE[i]][pos];
    }
    for (int i = 32; i < 48; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            black_value += PiecesValue[BLACK][PIECE_NUM_TO_TYPE[i]][pos];
    }

    situation.value[RED] = red_value;
    situation.value[BLACK] = black_value;
}